

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc64_fast.c
# Opt level: O2

uint64_t lzma_crc64(uint8_t *buf,size_t size,uint64_t crc)

{
  ulong uVar1;
  size_t sVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = ~crc;
  if (4 < size) {
    for (lVar4 = 0; ((int)buf + (int)lVar4 & 3U) != 0; lVar4 = lVar4 + 1) {
      uVar1 = uVar1 >> 8 ^ lzma_crc64_table[0][(uint)uVar1 & 0xff ^ (uint)buf[lVar4]];
    }
    buf = buf + (-(int)buf & 3);
    puVar3 = (uint *)((size - lVar4 & 0xfffffffffffffffc) + (long)buf);
    for (; buf < puVar3; buf = (uint8_t *)((long)buf + 4)) {
      uVar5 = *(uint *)buf ^ (uint)uVar1;
      uVar1 = uVar1 >> 0x20 ^ lzma_crc64_table[3][uVar5 & 0xff] ^
              lzma_crc64_table[2][uVar5 >> 8 & 0xff] ^
              *(ulong *)((long)lzma_crc64_table[1] + (ulong)(uVar5 >> 0xd & 0x7f8)) ^
              lzma_crc64_table[0][uVar5 >> 0x18];
    }
    size = (size_t)((uint)(size - lVar4) & 3);
  }
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 >> 8 ^
            lzma_crc64_table[0][(uint)uVar1 & 0xff ^ (uint)*(byte *)((long)buf + sVar2)];
  }
  return ~uVar1;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_crc64(const uint8_t *buf, size_t size, uint64_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	if (size > 4) {
		while ((uintptr_t)(buf) & 3) {
			crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);
			--size;
		}

		const uint8_t *const limit = buf + (size & ~(size_t)(3));
		size &= (size_t)(3);

		while (buf < limit) {
#ifdef WORDS_BIGENDIAN
			const uint32_t tmp = (crc >> 32)
					^ aligned_read32ne(buf);
#else
			const uint32_t tmp = crc ^ aligned_read32ne(buf);
#endif
			buf += 4;

			crc = lzma_crc64_table[3][A(tmp)]
			    ^ lzma_crc64_table[2][B(tmp)]
			    ^ S32(crc)
			    ^ lzma_crc64_table[1][C(tmp)]
			    ^ lzma_crc64_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	return ~crc;
}